

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_object.cpp
# Opt level: O2

Variable __thiscall
LiteScript::_Type_CLASS_OBJECT::OLogicalNot(_Type_CLASS_OBJECT *this,Variable *object)

{
  State *state;
  bool bVar1;
  Object *pOVar2;
  Type *this_00;
  Variable *in_RDX;
  uint *extraout_RDX;
  Variable VVar3;
  Variable VStack_68;
  Variable v;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> args;
  
  pOVar2 = Variable::operator->(in_RDX);
  Class::GetOperator((Class *)&v,(OperatorType)*(undefined8 *)((long)pOVar2->data + 0x38));
  pOVar2 = Variable::operator->(&v);
  this_00 = Object::GetType(pOVar2);
  bVar1 = Type::operator==(this_00,(Type *)_type_callback);
  if (bVar1) {
    pOVar2 = Variable::operator->(in_RDX);
    if (*(long *)((long)pOVar2->data + 0x40) != 0) {
      pOVar2 = Variable::operator->(&v);
      state = (State *)pOVar2->data;
      Nullable<LiteScript::Variable>::Nullable((Nullable<LiteScript::Variable> *)&args,in_RDX);
      Nullable<LiteScript::Variable>::operator=
                ((Nullable<LiteScript::Variable> *)&state->nsp_global,
                 (Nullable<LiteScript::Variable> *)&args);
      Nullable<LiteScript::Variable>::Nullify((Nullable<LiteScript::Variable> *)&args);
      args.super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      args.super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      args.super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Variable::Variable(&VStack_68,in_RDX);
      pOVar2 = Variable::operator->(&VStack_68);
      Callback::operator()
                ((Callback *)this,state,
                 *(vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> **)
                  ((long)pOVar2->data + 0x40));
      Variable::~Variable(&VStack_68);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector(&args);
      goto LAB_00129f09;
    }
  }
  pOVar2 = Variable::operator->(in_RDX);
  Memory::Create((Memory *)this,(Type *)pOVar2->memory);
LAB_00129f09:
  Variable::~Variable(&v);
  VVar3.nb_ref = extraout_RDX;
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CLASS_OBJECT::OLogicalNot(const Variable& object) const {
    Variable v = object->GetData<ClassObject>().ClassBase->GetOperator(Class::OperatorType::OP_TYPE_LOG_NOT);
    if (v->GetType() == Type::CALLBACK) {
        if (object->GetData<ClassObject>().ScriptState == nullptr)
            return object->memory.Create(Type::NIL);
        Callback &call = v->GetData<Callback>();
        call.This = Nullable<Variable>(object);
        std::vector<Variable> args;
        return call(*(Variable(object)->GetData<ClassObject>().ScriptState), args);
    }
    else {
        return object->memory.Create(Type::NIL);
    }
}